

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.h
# Opt level: O0

cmList * __thiscall
cmList::remove_items<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>>
          (cmList *this,__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> first,
          __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> last)

{
  cmList *pcVar1;
  allocator<long> local_49;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_48;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_40;
  vector<long,_std::allocator<long>_> local_38;
  cmList *local_20;
  cmList *this_local;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> last_local;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> first_local;
  
  local_48._M_current = last._M_current;
  local_40._M_current = first._M_current;
  local_20 = this;
  this_local = (cmList *)last._M_current;
  last_local = first;
  std::allocator<long>::allocator(&local_49);
  std::vector<long,std::allocator<long>>::
  vector<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,void>
            ((vector<long,std::allocator<long>> *)&local_38,local_40,local_48,&local_49);
  pcVar1 = RemoveItems(this,&local_38);
  std::vector<long,_std::allocator<long>_>::~vector(&local_38);
  std::allocator<long>::~allocator(&local_49);
  return pcVar1;
}

Assistant:

cmList& remove_items(InputIterator first, InputIterator last)
  {
    return this->RemoveItems(
      std::vector<typename InputIterator::value_type>{ first, last });
  }